

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_RDI;
  
  ~basic_memory_buffer(in_RDI);
  operator_delete(in_RDI,0x7f0);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }